

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O3

Dim * __thiscall
cnn::Conv1DWide::dim_forward
          (Dim *__return_storage_ptr__,Conv1DWide *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  uint uVar2;
  pointer pDVar3;
  long lVar4;
  ostream *poVar5;
  invalid_argument *this_00;
  uint local_18 [2];
  
  pDVar3 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar3 == 0x48) {
    if (((pDVar3->nd == 2) && (pDVar3[1].nd == 2)) && (pDVar3->d[0] == pDVar3[1].d[0])) {
      local_18[1] = pDVar3[1].d[1] + pDVar3->d[1] + -1;
      local_18[0] = pDVar3->d[0];
      __return_storage_ptr__->nd = 0;
      __return_storage_ptr__->bd = 1;
      lVar4 = 0;
      do {
        uVar1 = *(uint *)((long)local_18 + lVar4);
        uVar2 = __return_storage_ptr__->nd;
        __return_storage_ptr__->nd = uVar2 + 1;
        __return_storage_ptr__->d[uVar2] = uVar1;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 8);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad input dimensions in Conv1DWide: ",0x24);
    poVar5 = operator<<((ostream *)&std::cerr,xs);
    std::endl<char,std::char_traits<char>>(poVar5);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"bad input dimensions in Conv1DWide");
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Conv1DWide requires two inputs: ",0x20);
    poVar5 = operator<<((ostream *)&std::cerr,xs);
    std::endl<char,std::char_traits<char>>(poVar5);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Conv1DWide requires two inputs");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Conv1DWide::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2) {
    cerr << "Conv1DWide requires two inputs: " << xs << endl;
    throw std::invalid_argument("Conv1DWide requires two inputs");
  }
  unsigned ocols = xs[0].cols() + xs[1].cols() - 1;
  if (xs[0].ndims() != 2 || xs[1].ndims() != 2 ||
      xs[0].rows() != xs[1].rows()) {
    cerr << "Bad input dimensions in Conv1DWide: " << xs << endl;
    throw std::invalid_argument("bad input dimensions in Conv1DWide");
  }
  return Dim({xs[0].rows(), ocols});
}